

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void fetchTransformed_fetcher<(TextureBlendType)2,(QPixelLayout::BPP)6,unsigned_int>
               (uint *buffer,QSpanData *data,int y,int x,int length)

{
  ulong uVar1;
  undefined8 uVar2;
  uchar *puVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint *puVar10;
  int iVar11;
  uint *b;
  int iVar12;
  int iVar13;
  uint uVar14;
  double dVar15;
  uint uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  int iVar26;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar27;
  double dVar28;
  int iVar30;
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dStack_40;
  
  dVar22 = (double)x + 0.5;
  dVar28 = (double)y + 0.5;
  if ((data->field_0x8a & 1) == 0) {
LAB_00669b35:
    if (0 < length) {
      dVar15 = data->m11;
      dVar17 = data->m12;
      dVar20 = data->m13;
      puVar10 = buffer + length;
      dVar19 = data->m23 * dVar28 + dVar22 * dVar20 + data->m33;
      dVar21 = data->dx + data->m21 * dVar28 + dVar22 * dVar15;
      dVar22 = data->dy + data->m22 * dVar28 + dVar22 * dVar17;
      puVar3 = (data->field_23).texture.imageData;
      lVar5 = (data->field_23).texture.bytesPerLine;
      do {
        dVar18 = (double)(-(ulong)(dVar19 == 0.0) & 0x3ff0000000000000 |
                         ~-(ulong)(dVar19 == 0.0) & (ulong)(1.0 / dVar19));
        dVar28 = floor(dVar21 * dVar18);
        dVar18 = floor(dVar22 * dVar18);
        iVar13 = (data->field_23).texture.y2 + -1;
        iVar12 = (int)dVar18;
        if (iVar13 <= (int)dVar18) {
          iVar12 = iVar13;
        }
        iVar13 = (data->field_23).texture.x1;
        iVar27 = (data->field_23).texture.y1;
        if (iVar12 <= iVar27) {
          iVar12 = iVar27;
        }
        iVar11 = (data->field_23).texture.x2 + -1;
        iVar27 = (int)dVar28;
        if (iVar11 <= (int)dVar28) {
          iVar27 = iVar11;
        }
        if (iVar27 <= iVar13) {
          iVar27 = iVar13;
        }
        *buffer = *(uint *)(puVar3 + (long)iVar27 * 4 + iVar12 * lVar5);
        dVar21 = dVar21 + dVar15;
        dVar22 = dVar22 + dVar17;
        dVar19 = dVar19 + dVar20;
        dVar19 = (double)((ulong)dVar19 & -(ulong)(dVar19 != 0.0) |
                         ~-(ulong)(dVar19 != 0.0) & (ulong)(dVar20 + dVar19));
        buffer = buffer + 1;
      } while (buffer < puVar10);
    }
    return;
  }
  dVar17 = (data->m21 * dVar28 + dVar22 * data->m11 + data->dx) * 65536.0;
  dVar20 = (data->m22 * dVar28 + dVar22 * data->m12 + data->dy) * 65536.0;
  dVar15 = dVar20;
  if (dVar17 <= dVar20) {
    dVar15 = dVar17;
  }
  dVar19 = data->m11 * 65536.0;
  dVar21 = data->m12 * 65536.0;
  auVar25._8_4_ = SUB84(dVar21,0);
  auVar25._0_8_ = dVar19;
  auVar25._12_4_ = (int)((ulong)dVar21 >> 0x20);
  dVar19 = trunc(dVar19);
  dStack_40 = auVar25._8_8_;
  dVar21 = trunc(dStack_40);
  dVar18 = (double)length * dVar19 + dVar17;
  dVar21 = (double)length * dVar21 + dVar20;
  dVar19 = dVar21;
  if (dVar18 <= dVar21) {
    dVar19 = dVar18;
  }
  if (dVar15 <= dVar19) {
    dVar19 = dVar15;
  }
  if (dVar19 < -2147483648.0) goto LAB_00669b35;
  if (dVar20 <= dVar17) {
    dVar20 = dVar17;
  }
  if (dVar21 <= dVar18) {
    dVar21 = dVar18;
  }
  if (dVar21 <= dVar20) {
    dVar21 = dVar20;
  }
  if (2147483647.0 < dVar21) goto LAB_00669b35;
  uVar14 = (uint)(data->m11 * 65536.0);
  uVar16 = (uint)(data->m12 * 65536.0);
  iVar12 = (int)((data->m21 * dVar28 + dVar22 * data->m11 + data->dx) * 65536.0);
  iVar13 = (int)((data->m22 * dVar28 + dVar22 * data->m12 + data->dy) * 65536.0);
  if (uVar16 == 0) {
    iVar27 = (data->field_23).texture.y2 + -1;
    if (iVar13 >> 0x10 < iVar27) {
      iVar27 = iVar13 >> 0x10;
    }
    iVar13 = (data->field_23).texture.y1;
    if (iVar27 <= iVar13) {
      iVar27 = iVar13;
    }
    lVar5 = (long)iVar27 * (data->field_23).texture.bytesPerLine;
    puVar3 = (data->field_23).texture.imageData;
    if ((int)uVar14 < 1) {
      uVar16 = length;
      if (-1 < (int)uVar14) goto LAB_00669f07;
      lVar6 = (long)(data->field_23).texture.x1 * 0x10000 - (long)iVar12;
      uVar9 = (ulong)(int)uVar14;
    }
    else {
      lVar6 = ((long)(data->field_23).texture.x2 * 0x10000 - (long)iVar12) + -0x10000;
      uVar9 = (ulong)uVar14;
    }
    uVar16 = (uint)(lVar6 / (long)uVar9);
    if (length <= (int)uVar16) {
      uVar16 = length;
    }
LAB_00669f07:
    if ((int)uVar16 < 1) {
      uVar9 = 0;
    }
    else {
      uVar8 = 0;
      do {
        iVar11 = iVar12 >> 0x10;
        iVar13 = (data->field_23).texture.x1;
        iVar27 = (data->field_23).texture.x2 + -1;
        if (iVar11 < iVar27) {
          iVar27 = iVar11;
        }
        if (iVar27 <= iVar13) {
          iVar27 = iVar13;
        }
        uVar9 = uVar8;
        if (iVar27 == iVar11) break;
        buffer[uVar8] = *(uint *)(puVar3 + (long)iVar27 * 4 + lVar5);
        iVar12 = iVar12 + uVar14;
        uVar8 = uVar8 + 1;
        uVar9 = (ulong)uVar16;
      } while (uVar16 != uVar8);
    }
    if ((int)uVar9 < (int)uVar16) {
      puVar10 = buffer + (uVar9 & 0xffffffff);
      do {
        *puVar10 = *(uint *)(puVar3 + (long)(iVar12 >> 0x10) * 4 + lVar5);
        iVar12 = iVar12 + uVar14;
        puVar10 = puVar10 + 1;
        uVar7 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar7;
      } while ((int)uVar7 < (int)uVar16);
    }
    if (length <= (int)uVar9) {
      return;
    }
    puVar10 = buffer + (uVar9 & 0xffffffff);
    do {
      iVar13 = (data->field_23).texture.x2 + -1;
      if (iVar12 >> 0x10 < iVar13) {
        iVar13 = iVar12 >> 0x10;
      }
      iVar27 = (data->field_23).texture.x1;
      if (iVar13 <= iVar27) {
        iVar13 = iVar27;
      }
      *puVar10 = *(uint *)(puVar3 + (long)iVar13 * 4 + lVar5);
      iVar12 = iVar12 + uVar14;
      puVar10 = puVar10 + 1;
      uVar16 = (int)uVar9 + 1;
      uVar9 = (ulong)uVar16;
    } while ((int)uVar16 < length);
    return;
  }
  if ((int)uVar14 < 1) {
    uVar7 = length;
    if (-1 < (int)uVar14) goto LAB_00669d18;
    lVar5 = (long)(data->field_23).texture.x1 * 0x10000 - (long)iVar12;
    uVar9 = (ulong)(int)uVar14;
  }
  else {
    lVar5 = ((long)(data->field_23).texture.x2 * 0x10000 - (long)iVar12) + -0x10000;
    uVar9 = (ulong)uVar14;
  }
  uVar7 = (uint)(lVar5 / (long)uVar9);
  if (length <= (int)uVar7) {
    uVar7 = length;
  }
LAB_00669d18:
  if ((int)uVar16 < 1) {
    lVar5 = (long)(data->field_23).texture.y1 * 0x10000 - (long)iVar13;
    uVar9 = (ulong)(int)uVar16;
  }
  else {
    lVar5 = ((long)(data->field_23).texture.y2 * 0x10000 - (long)iVar13) + -0x10000;
    uVar9 = (ulong)uVar16;
  }
  uVar4 = (uint)(lVar5 / (long)uVar9);
  if ((int)uVar7 < (int)uVar4) {
    uVar4 = uVar7;
  }
  if ((int)uVar4 < 1) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    do {
      iVar27 = iVar12 >> 0x10;
      iVar30 = iVar13 >> 0x10;
      uVar1 = *(ulong *)((long)&data->field_23 + 0x10);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar1;
      uVar2 = *(undefined8 *)((long)&data->field_23 + 0x18);
      auVar23._0_4_ = (int)uVar2 + -1;
      auVar23._4_4_ = (int)((ulong)uVar2 >> 0x20) + -1;
      auVar23._8_4_ = 0xffffffff;
      auVar23._12_4_ = 0xffffffff;
      auVar32._0_8_ = CONCAT44(-(uint)(iVar30 < auVar23._4_4_),-(uint)(iVar27 < auVar23._0_4_));
      auVar32._8_8_ = 0;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = CONCAT44(iVar30,iVar27) & auVar32._0_8_;
      auVar33 = ~auVar32 & auVar23 | auVar33;
      auVar24._0_4_ = -(uint)((int)uVar1 < auVar33._0_4_);
      auVar24._4_4_ = -(uint)((int)(uVar1 >> 0x20) < auVar33._4_4_);
      auVar24._8_4_ = -(uint)(0 < auVar33._8_4_);
      auVar24._12_4_ = -(uint)(0 < auVar33._12_4_);
      auVar25 = ~auVar24 & auVar31 | auVar33 & auVar24;
      iVar11 = auVar25._0_4_;
      auVar29._0_4_ = -(uint)(iVar27 == iVar11);
      iVar26 = auVar25._4_4_;
      iVar27 = -(uint)(iVar30 == iVar26);
      auVar29._4_4_ = auVar29._0_4_;
      auVar29._8_4_ = iVar27;
      auVar29._12_4_ = iVar27;
      iVar27 = movmskpd((int)uVar9,auVar29);
      uVar9 = (ulong)CONCAT31((int3)((uint)iVar27 >> 8),iVar27 != 3);
      if (iVar27 == 3) goto LAB_00669e1c;
      buffer[uVar8] =
           *(uint *)((data->field_23).texture.imageData +
                    (long)iVar11 * 4 + (long)iVar26 * (data->field_23).texture.bytesPerLine);
      iVar12 = iVar12 + uVar14;
      iVar13 = iVar13 + uVar16;
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
    uVar8 = (ulong)uVar4;
  }
LAB_00669e1c:
  if ((int)uVar8 < (int)uVar4) {
    puVar3 = (data->field_23).texture.imageData;
    lVar5 = (data->field_23).texture.bytesPerLine;
    puVar10 = buffer + (uVar8 & 0xffffffff);
    do {
      *puVar10 = *(uint *)(puVar3 + (long)(iVar12 >> 0x10) * 4 + (iVar13 >> 0x10) * lVar5);
      iVar12 = iVar12 + uVar14;
      iVar13 = iVar13 + uVar16;
      puVar10 = puVar10 + 1;
      uVar7 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar7;
    } while ((int)uVar7 < (int)uVar4);
  }
  if (length <= (int)uVar8) {
    return;
  }
  puVar3 = (data->field_23).texture.imageData;
  lVar5 = (data->field_23).texture.bytesPerLine;
  puVar10 = buffer + (uVar8 & 0xffffffff);
  do {
    iVar27 = (data->field_23).texture.x2 + -1;
    if (iVar12 >> 0x10 < iVar27) {
      iVar27 = iVar12 >> 0x10;
    }
    iVar11 = (data->field_23).texture.x1;
    iVar26 = (data->field_23).texture.y1;
    if (iVar27 <= iVar11) {
      iVar27 = iVar11;
    }
    iVar11 = (data->field_23).texture.y2 + -1;
    if (iVar13 >> 0x10 < iVar11) {
      iVar11 = iVar13 >> 0x10;
    }
    if (iVar11 <= iVar26) {
      iVar11 = iVar26;
    }
    *puVar10 = *(uint *)(puVar3 + (long)iVar27 * 4 + iVar11 * lVar5);
    iVar12 = iVar12 + uVar14;
    iVar13 = iVar13 + uVar16;
    puVar10 = puVar10 + 1;
    uVar7 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar7;
  } while ((int)uVar7 < length);
  return;
}

Assistant:

static void QT_FASTCALL fetchTransformed_fetcher(T *buffer, const QSpanData *data,
                                                 int y, int x, int length)
{
    static_assert(blendType == BlendTransformed || blendType == BlendTransformedTiled);
    const QTextureData &image = data->texture;

    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);

    constexpr bool useFetch = (bpp < QPixelLayout::BPP32) && sizeof(T) == sizeof(uint);
    const QPixelLayout *layout = &qPixelLayouts[data->texture.format];
    if (!useFetch)
        Q_ASSERT(layout->bpp == bpp || (layout->bpp == QPixelLayout::BPP16FPx4 && bpp == QPixelLayout::BPP64));
    // When templated 'fetch' should be inlined at compile time:
    const Fetch1PixelFunc fetch1 = (bpp == QPixelLayout::BPPNone) ? fetch1PixelTable[layout->bpp] : Fetch1PixelFunc(fetch1Pixel<bpp>);

    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy
                      + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy
                      + data->m12 * cx + data->dy) * fixed_scale);

        if (fdy == 0) { // simple scale, no rotation or shear
            int py = (fy >> 16);
            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            const uchar *src = image.scanLine(py);

            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int x2 = x1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    if (x1 == x2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[x1];
                    fx += fdx;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(src, px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(src)[px];
                    fx += fdx;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                if constexpr (useFetch)
                    buffer[i] = fetch1(src, px);
                else
                    buffer[i] = reinterpret_cast<const T*>(src)[px];
                fx += fdx;
            }
        } else { // rotation or shear
            int i = 0;
            if (blendType == BlendTransformed) {
                int fastLen = length;
                if (fdx > 0)
                    fastLen = qMin(fastLen, int((qint64(image.x2 - 1) * fixed_scale - fx) / fdx));
                else if (fdx < 0)
                    fastLen = qMin(fastLen, int((qint64(image.x1) * fixed_scale - fx) / fdx));
                if (fdy > 0)
                    fastLen = qMin(fastLen, int((qint64(image.y2 - 1) * fixed_scale - fy) / fdy));
                else if (fdy < 0)
                    fastLen = qMin(fastLen, int((qint64(image.y1) * fixed_scale - fy) / fdy));

                for (; i < fastLen; ++i) {
                    int x1 = (fx >> 16);
                    int y1 = (fy >> 16);
                    int x2 = x1;
                    int y2 = y1;
                    fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1);
                    fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1);
                    if (x1 == x2 && y1 == y2)
                        break;
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(y1), x1);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(y1))[x1];
                    fx += fdx;
                    fy += fdy;
                }

                for (; i < fastLen; ++i) {
                    int px = (fx >> 16);
                    int py = (fy >> 16);
                    if constexpr (useFetch)
                        buffer[i] = fetch1(image.scanLine(py), px);
                    else
                        buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                    fx += fdx;
                    fy += fdy;
                }
            }

            for (; i < length; ++i) {
                int px = (fx >> 16);
                int py = (fy >> 16);
                fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
                fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
                if constexpr (useFetch)
                    buffer[i] = fetch1(image.scanLine(py), px);
                else
                    buffer[i] = reinterpret_cast<const T*>(image.scanLine(py))[px];
                fx += fdx;
                fy += fdy;
            }
        }
    } else {
        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        T *const end = buffer + length;
        T *b = buffer;
        while (b < end) {
            const qreal iw = fw == 0 ? 1 : 1 / fw;
            const qreal tx = fx * iw;
            const qreal ty = fy * iw;
            int px = qFloor(tx);
            int py = qFloor(ty);

            fetchTransformed_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, py);
            fetchTransformed_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, px);
            if constexpr (useFetch)
                *b = fetch1(image.scanLine(py), px);
            else
                *b = reinterpret_cast<const T*>(image.scanLine(py))[px];

            fx += fdx;
            fy += fdy;
            fw += fdw;
            //force increment to avoid /0
            if (!fw) {
                fw += fdw;
            }
            ++b;
        }
    }
}